

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O2

BufferChain * __thiscall TcpConn::Alloc(TcpConn *this)

{
  BufferChain *pBVar1;
  
  pBVar1 = MemPoolC<BufferChain,_4096>::Get(&((this->super_PollObj).m_pPoller)->buffPool,0x1000);
  pBVar1->read = 0;
  pBVar1->write = 0;
  pBVar1->refcount = 1;
  pBVar1->nextpkt = (BufferChain *)0x0;
  return pBVar1;
}

Assistant:

BufferChain* TcpConn::Alloc()
{
    auto* bc = this->m_pPoller->BuffPool().Get();
    bc->Init();
    return bc;
}